

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O0

void __thiscall wabt::interp::Istream::ResolveFixupU32(Istream *this,Offset fixup_offset)

{
  Offset val;
  Offset fixup_offset_local;
  Istream *this_local;
  
  val = end(this);
  EmitAt<unsigned_int>(this,fixup_offset,val);
  return;
}

Assistant:

void Istream::ResolveFixupU32(Offset fixup_offset) {
  EmitAt(fixup_offset, end());
}